

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall
mkvparser::Cues::Find(Cues *this,longlong time_ns,Track *pTrack,CuePoint **pCP,TrackPosition **pTP)

{
  TrackPosition *pTVar1;
  CuePoint **ppCVar2;
  CuePoint **ppCVar3;
  CuePoint *pCVar4;
  long lVar5;
  TrackPosition *pTVar6;
  TrackPosition *pTVar7;
  longlong scale;
  CuePoint **ppCVar8;
  CuePoint **ppCVar9;
  CuePoint **ppCVar10;
  long lVar11;
  
  if (((pTrack == (Track *)0x0 || time_ns < 0) ||
      (ppCVar3 = this->m_cue_points, ppCVar3 == (CuePoint **)0x0)) ||
     (lVar11 = this->m_count, lVar11 == 0)) {
    return false;
  }
  pCVar4 = *ppCVar3;
  *pCP = pCVar4;
  if (pCVar4 == (CuePoint *)0x0) {
    return false;
  }
  lVar5 = this->m_pSegment->m_pInfo->m_timecodeScale;
  if (pCVar4->m_timecode * lVar5 < time_ns) {
    ppCVar2 = ppCVar3 + lVar11;
    ppCVar8 = ppCVar2;
    ppCVar10 = ppCVar3;
    while (ppCVar10 < ppCVar8) {
      ppCVar9 = (CuePoint **)
                ((long)ppCVar10 +
                (((long)ppCVar8 - (long)ppCVar10 >> 3) - ((long)ppCVar8 - (long)ppCVar10 >> 0x3f) &
                0xfffffffffffffffeU) * 4);
      if (ppCVar2 <= ppCVar9) {
        return false;
      }
      if (*ppCVar9 == (CuePoint *)0x0) {
        return false;
      }
      lVar11 = (*ppCVar9)->m_timecode * lVar5;
      if (lVar11 - time_ns == 0 || lVar11 < time_ns) {
        ppCVar10 = ppCVar9 + 1;
        ppCVar9 = ppCVar8;
      }
      ppCVar8 = ppCVar9;
      if (ppCVar9 < ppCVar10) {
        return false;
      }
    }
    if (ppCVar10 <= ppCVar3) {
      return false;
    }
    if (ppCVar10 != ppCVar8) {
      return false;
    }
    if (ppCVar2 < ppCVar10) {
      return false;
    }
    pCVar4 = ppCVar8[-1];
    *pCP = pCVar4;
    if (pCVar4 == (CuePoint *)0x0) {
      return false;
    }
    lVar11 = pCVar4->m_timecode * this->m_pSegment->m_pInfo->m_timecodeScale;
    if (lVar11 - time_ns != 0 && time_ns <= lVar11) {
      return false;
    }
    lVar11 = pCVar4->m_track_positions_count * 0x18;
    pTVar7 = pCVar4->m_track_positions + -1;
    do {
      if (lVar11 == 0) goto LAB_00157334;
      pTVar6 = pTVar7 + 1;
      lVar11 = lVar11 + -0x18;
      pTVar1 = pTVar7 + 1;
      pTVar7 = pTVar6;
    } while (pTVar1->m_track != (pTrack->m_info).number);
  }
  else {
    lVar11 = pCVar4->m_track_positions_count * 0x18;
    pTVar7 = pCVar4->m_track_positions + -1;
    do {
      if (lVar11 == 0) goto LAB_00157334;
      pTVar6 = pTVar7 + 1;
      lVar11 = lVar11 + -0x18;
      pTVar1 = pTVar7 + 1;
      pTVar7 = pTVar6;
    } while (pTVar1->m_track != (pTrack->m_info).number);
  }
LAB_00157336:
  *pTP = pTVar6;
  return pTVar6 != (TrackPosition *)0x0;
LAB_00157334:
  pTVar6 = (TrackPosition *)0x0;
  goto LAB_00157336;
}

Assistant:

bool Cues::Find(long long time_ns, const Track* pTrack, const CuePoint*& pCP,
                const CuePoint::TrackPosition*& pTP) const {
  if (time_ns < 0 || pTrack == NULL || m_cue_points == NULL || m_count == 0)
    return false;

  CuePoint** const ii = m_cue_points;
  CuePoint** i = ii;

  CuePoint** const jj = ii + m_count;
  CuePoint** j = jj;

  pCP = *i;
  if (pCP == NULL)
    return false;

  if (time_ns <= pCP->GetTime(m_pSegment)) {
    pTP = pCP->Find(pTrack);
    return (pTP != NULL);
  }

  while (i < j) {
    // INVARIANT:
    //[ii, i) <= time_ns
    //[i, j)  ?
    //[j, jj) > time_ns

    CuePoint** const k = i + (j - i) / 2;
    if (k >= jj)
      return false;

    CuePoint* const pCP = *k;
    if (pCP == NULL)
      return false;

    const long long t = pCP->GetTime(m_pSegment);

    if (t <= time_ns)
      i = k + 1;
    else
      j = k;

    if (i > j)
      return false;
  }

  if (i != j || i > jj || i <= ii)
    return false;

  pCP = *--i;

  if (pCP == NULL || pCP->GetTime(m_pSegment) > time_ns)
    return false;

  // TODO: here and elsewhere, it's probably not correct to search
  // for the cue point with this time, and then search for a matching
  // track.  In principle, the matching track could be on some earlier
  // cue point, and with our current algorithm, we'd miss it.  To make
  // this bullet-proof, we'd need to create a secondary structure,
  // with a list of cue points that apply to a track, and then search
  // that track-based structure for a matching cue point.

  pTP = pCP->Find(pTrack);
  return (pTP != NULL);
}